

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib598.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    return 0x7e;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  if (((((iVar1 != 0) || (iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 != 0)) ||
       (iVar1 = curl_easy_setopt(lVar3,0x2720,"http://example.com/the-moo"), iVar1 != 0)) ||
      ((iVar1 = curl_easy_setopt(lVar3,0x2722,"the-moo agent next generation"), iVar1 != 0 ||
       (iVar1 = curl_easy_setopt(lVar3,0x2726,"name=moo"), iVar1 != 0)))) ||
     (iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 != 0)) goto LAB_001012ca;
  iVar2 = curl_easy_perform(lVar3);
  if (iVar2 == 0) {
    curl_easy_reset(lVar3);
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    if ((iVar1 != 0) || (iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 != 0)) goto LAB_001012ca;
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    if ((iVar1 != 0) || (iVar2 = curl_easy_perform(lVar3), iVar1 = 0, iVar2 == 0))
    goto LAB_001012ca;
    pcVar4 = "retrieve 2 failed\n";
  }
  else {
    pcVar4 = "retrieve 1 failed\n";
  }
  curl_mfprintf(_stderr,pcVar4);
  iVar1 = iVar2;
LAB_001012ca:
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_REFERER, "http://example.com/the-moo");
  test_setopt(curl, CURLOPT_USERAGENT, "the-moo agent next generation");
  test_setopt(curl, CURLOPT_COOKIE, "name=moo");
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_easy_reset(curl);

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);
  if(res)
    fprintf(stderr, "retrieve 2 failed\n");

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}